

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLTools.h
# Opt level: O2

string * Assimp::XMLEscape(string *__return_storage_ptr__,string *data)

{
  char cVar1;
  size_type sVar2;
  undefined8 in_RAX;
  size_t i;
  size_type sVar3;
  undefined7 uStack_38;
  char c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar2 = data->_M_string_length;
  _uStack_38 = in_RAX;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    cVar1 = (data->_M_dataplus)._M_p[sVar3];
    _uStack_38 = CONCAT17(cVar1,uStack_38);
    if ((((cVar1 == '\"') || (cVar1 == '>')) || (cVar1 == '\'')) ||
       ((cVar1 == '<' || (cVar1 == '&')))) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XMLEscape(const std::string& data) {
        std::string buffer;

        const size_t size = data.size();
        buffer.reserve(size + size / 8);
        for(size_t i = 0; i < size; ++i) {
            const char c = data[i];
            switch(c) {
                case '&' :
                    buffer.append("&amp;");
                    break;
                case '\"':
                    buffer.append("&quot;");
                    break;
                case '\'':
                    buffer.append("&apos;");
                    break;
                case '<' :
                    buffer.append("&lt;");
                    break;
                case '>' :
                    buffer.append("&gt;");
                    break;
                default:
                    buffer.append(&c, 1);
                    break;
            }
        }
        return buffer;
    }